

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O1

uint64_t __thiscall rcg::Buffer::getTimestamp(Buffer *this)

{
  GC_ERROR GVar1;
  void *pvVar2;
  unsigned_long ret;
  size_t size;
  INFO_DATATYPE type;
  uint64_t local_20 [2];
  INFO_DATATYPE local_c;
  
  if ((this->payload_type == 4) &&
     ((this->nodemap).super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)0x0)) {
    local_20[0] = getInteger(&this->nodemap,"ChunkTimestamp",(int64_t *)0x0,(int64_t *)0x0,true,
                             false);
  }
  else {
    pvVar2 = Stream::getHandle(this->parent);
    local_20[0] = 0;
    local_20[1] = 8;
    if ((this->buffer != (BUFFER_HANDLE)0x0 && pvVar2 != (void *)0x0) &&
       (GVar1 = (*((this->gentl).
                   super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  DSGetBufferInfo)(pvVar2,this->buffer,3,&local_c,local_20,local_20 + 1), GVar1 != 0
       )) {
      local_20[0] = 0;
    }
  }
  return local_20[0];
}

Assistant:

uint64_t Buffer::getTimestamp() const
{
  if (payload_type == PAYLOAD_TYPE_CHUNK_DATA && nodemap)
  {
    try
    {
      return getInteger(nodemap, "ChunkTimestamp", 0, 0, true);
    }
    catch (const std::exception &)
    {
      // ignore error and try getBufferValue()
    }
  }

  return getBufferValue<uint64_t>(gentl, parent->getHandle(), buffer,
                                  GenTL::BUFFER_INFO_TIMESTAMP);
}